

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_r4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  float *array;
  long lVar4;
  long lVar5;
  size_t __nmemb;
  long *plVar6;
  long *plVar7;
  long nx;
  long lVar8;
  float nullvalue;
  float minvalue;
  fitsfile *local_168;
  imgstats *local_160;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  long ngood;
  int anynul;
  float maxvalue;
  double sigma;
  double mean;
  long lpixel [9];
  long fpixel [9];
  long inc [9];
  
  plVar6 = &DAT_001c9ce0;
  plVar7 = fpixel;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar7 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar7 = plVar7 + 1;
  }
  plVar6 = &DAT_001c9ce0;
  plVar7 = lpixel;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar7 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar7 = plVar7 + 1;
  }
  plVar6 = &DAT_001c9ce0;
  plVar7 = inc;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar7 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar7 = plVar7 + 1;
  }
  lVar4 = *naxes;
  lpixel[0] = (long)(XSAMPLE / 2) + lVar4 / 2;
  fpixel[0] = lVar4 / 2 - (long)(XSAMPLE / 2 + -1);
  if (fpixel[0] < 2) {
    fpixel[0] = 1;
  }
  if (lVar4 <= lpixel[0]) {
    lpixel[0] = lVar4;
  }
  nx = (lpixel[0] - fpixel[0]) + 1;
  lVar4 = fpixel[0];
  lVar8 = lpixel[0];
  if (1 < naxis) {
    lVar1 = naxes[1];
    lVar8 = (long)(YSAMPLE / 2) + lVar1 / 2;
    lVar5 = lVar1 / 2 - (long)(YSAMPLE / 2 + -1);
    lVar4 = 1;
    if (1 < lVar5) {
      lVar4 = lVar5;
    }
    lpixel[1] = lVar8;
    fpixel[1] = lVar4;
    if (lVar1 <= lVar8) {
      lVar8 = lVar1;
      lpixel[1] = lVar1;
    }
  }
  lVar4 = (lVar8 - lVar4) + 1;
  __nmemb = lVar4 * nx;
  if (2 < naxis) {
    lpixel[2] = naxes[2] / 2 + 1;
    fpixel[2] = lpixel[2];
  }
  local_168 = infptr;
  local_160 = imagestats;
  array = (float *)calloc(__nmemb,4);
  if (array == (float *)0x0) {
    *status = 0x71;
    iVar3 = 0x71;
  }
  else {
    ffgsve(local_168,0,naxis,naxes,fpixel,lpixel,inc,-9.11912e-36,array,&anynul,status);
    nullvalue = -9.11912e-36;
    if (anynul == 0) {
      nullvalue = 0.0;
    }
    fits_img_stats_float
              (array,nx,lVar4,(uint)(anynul != 0),nullvalue,&ngood,&minvalue,&maxvalue,&mean,&sigma,
               &noise1,&noise2,&noise3,&noise5,status);
    local_160->n_nulls = (int)__nmemb - (int)ngood;
    auVar2._8_4_ = SUB84((double)maxvalue,0);
    auVar2._0_8_ = (double)minvalue;
    auVar2._12_4_ = (int)((ulong)(double)maxvalue >> 0x20);
    local_160->minval = (double)minvalue;
    local_160->maxval = (double)auVar2._8_8_;
    local_160->mean = mean;
    local_160->sigma = sigma;
    local_160->noise1 = noise1;
    local_160->noise2 = noise2;
    local_160->noise3 = noise3;
    local_160->noise5 = noise5;
    free(array);
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int fp_r4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	float *array, minvalue, maxvalue, nullvalue = FLOATNULLVALUE;
	int anynul,checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	array = calloc(npix, sizeof(float));
	if (!array) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	fits_read_subset_flt(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    nullvalue, array, &anynul, status);

	/* are there any null values in the array? */
	if (!anynul) {
	   nullvalue = 0.;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_float(array, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(array);
	return(*status);
}